

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singleton.h
# Opt level: O0

ostream * es::init::operator<<(ostream *os,singletons_meta_data *md)

{
  ostream *poVar1;
  void *in_RSI;
  ostream *in_RDI;
  char *local_20;
  
  poVar1 = std::operator<<(in_RDI,"singleton meta data: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RSI);
  poVar1 = std::operator<<(poVar1," p: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(void **)((long)in_RSI + 0x10));
  poVar1 = std::operator<<(poVar1," init count: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(uint *)((long)in_RSI + 0x20));
  poVar1 = std::operator<<(poVar1," flags: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(uint *)((long)in_RSI + 0x24));
  poVar1 = std::operator<<(poVar1," func name: ");
  if (*(long *)((long)in_RSI + 0x18) == 0) {
    local_20 = "\'\'";
  }
  else {
    local_20 = *(char **)((long)in_RSI + 0x18);
  }
  std::operator<<(poVar1,local_20);
  return in_RDI;
}

Assistant:

inline std::ostream& operator<<(std::ostream& os, const singletons_meta_data& md)
{
    os << "singleton meta data: " << (void*)&md << " p: " << (void*)md._p << " init count: " << md._init_count
       << " flags: " << md._flags << " func name: " << (md._func_name ? md._func_name : "''");
    return os;
}